

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conncache.c
# Opt level: O0

_Bool cpool_foreach(Curl_easy *data,cpool *cpool,void *param,
                   _func_int_Curl_easy_ptr_connectdata_ptr_void_ptr *func)

{
  Curl_llist *list;
  int iVar1;
  void *pvVar2;
  connectdata *conn;
  cpool_bundle *bundle;
  Curl_llist_node *curr;
  Curl_hash_element *he;
  Curl_hash_iterator iter;
  _func_int_Curl_easy_ptr_connectdata_ptr_void_ptr *func_local;
  void *param_local;
  cpool *cpool_local;
  Curl_easy *data_local;
  
  if (cpool != (cpool *)0x0) {
    iter.current_element = (Curl_llist_node *)func;
    Curl_hash_start_iterate(&cpool->dest2bundle,(Curl_hash_iterator *)&he);
    curr = &Curl_hash_next_element((Curl_hash_iterator *)&he)->list;
    while (curr != (Curl_llist_node *)0x0) {
      list = curr[1]._list;
      curr = &Curl_hash_next_element((Curl_hash_iterator *)&he)->list;
      bundle = (cpool_bundle *)Curl_llist_head(list);
      while (bundle != (cpool_bundle *)0x0) {
        pvVar2 = Curl_node_elem((Curl_llist_node *)bundle);
        bundle = (cpool_bundle *)Curl_node_next((Curl_llist_node *)bundle);
        iVar1 = (*(code *)iter.current_element)(data,pvVar2,param);
        if (iVar1 == 1) {
          return true;
        }
      }
    }
  }
  return false;
}

Assistant:

static bool cpool_foreach(struct Curl_easy *data,
                          struct cpool *cpool,
                          void *param,
                          int (*func)(struct Curl_easy *data,
                                      struct connectdata *conn, void *param))
{
  struct Curl_hash_iterator iter;
  struct Curl_hash_element *he;

  if(!cpool)
    return FALSE;

  Curl_hash_start_iterate(&cpool->dest2bundle, &iter);

  he = Curl_hash_next_element(&iter);
  while(he) {
    struct Curl_llist_node *curr;
    struct cpool_bundle *bundle = he->ptr;
    he = Curl_hash_next_element(&iter);

    curr = Curl_llist_head(&bundle->conns);
    while(curr) {
      /* Yes, we need to update curr before calling func(), because func()
         might decide to remove the connection */
      struct connectdata *conn = Curl_node_elem(curr);
      curr = Curl_node_next(curr);

      if(1 == func(data, conn, param)) {
        return TRUE;
      }
    }
  }
  return FALSE;
}